

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupDfsGuided(Aig_Man_t *p,Vec_Ptr_t *vPios)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Vec_Int_t *pVVar4;
  Aig_Obj_t **ppAVar5;
  Aig_Obj_t *pAVar6;
  Aig_Obj_t *pAVar7;
  Tim_Man_t *pTVar8;
  int local_34;
  int nNodes;
  int i;
  Aig_Obj_t *pObjNew;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  Vec_Ptr_t *vPios_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  p_00->nAsserts = p->nAsserts;
  p_00->nConstrs = p->nConstrs;
  p_00->nBarBufs = p->nBarBufs;
  if (p->vFlopNums != (Vec_Int_t *)0x0) {
    pVVar4 = Vec_IntDup(p->vFlopNums);
    p_00->vFlopNums = pVVar4;
  }
  if (p->pEquivs != (Aig_Obj_t **)0x0) {
    iVar1 = Aig_ManObjNumMax(p);
    ppAVar5 = (Aig_Obj_t **)malloc((long)iVar1 << 3);
    p_00->pEquivs = ppAVar5;
    ppAVar5 = p_00->pEquivs;
    iVar1 = Aig_ManObjNumMax(p);
    memset(ppAVar5,0,(long)iVar1 << 3);
  }
  if (p->pReprs != (Aig_Obj_t **)0x0) {
    iVar1 = Aig_ManObjNumMax(p);
    ppAVar5 = (Aig_Obj_t **)malloc((long)iVar1 << 3);
    p_00->pReprs = ppAVar5;
    ppAVar5 = p_00->pReprs;
    iVar1 = Aig_ManObjNumMax(p);
    memset(ppAVar5,0,(long)iVar1 << 3);
  }
  Aig_ManCleanData(p);
  pAVar6 = Aig_ManConst1(p_00);
  pAVar7 = Aig_ManConst1(p);
  (pAVar7->field_5).pData = pAVar6;
  for (local_34 = 0; iVar1 = Vec_PtrSize(vPios), local_34 < iVar1; local_34 = local_34 + 1) {
    pAVar6 = (Aig_Obj_t *)Vec_PtrEntry(vPios,local_34);
    iVar1 = Aig_ObjIsCi(pAVar6);
    if (iVar1 == 0) {
      iVar1 = Aig_ObjIsCo(pAVar6);
      if (iVar1 != 0) {
        pAVar7 = Aig_ObjFanin0(pAVar6);
        Aig_ManDupDfsGuided_rec(p_00,p,pAVar7);
        pAVar7 = Aig_ObjChild0Copy(pAVar6);
        pAVar7 = Aig_ObjCreateCo(p_00,pAVar7);
        (pAVar6->field_5).pData = pAVar7;
      }
    }
    else {
      pAVar7 = Aig_ObjCreateCi(p_00);
      *(ulong *)&pAVar7->field_0x18 =
           *(ulong *)&pAVar7->field_0x18 & 0xff000000ffffffff |
           (ulong)((uint)((ulong)*(undefined8 *)&pAVar6->field_0x18 >> 0x20) & 0xffffff) << 0x20;
      (pAVar6->field_5).pData = pAVar7;
    }
  }
  if (((p->pEquivs == (Aig_Obj_t **)0x0) && (p->pReprs == (Aig_Obj_t **)0x0)) &&
     (uVar2 = Aig_ManCleanup(p_00), uVar2 != 0)) {
    printf("Aig_ManDupDfs(): Cleanup after AIG duplication removed %d nodes.\n",(ulong)uVar2);
  }
  iVar1 = Aig_ManRegNum(p);
  Aig_ManSetRegNum(p_00,iVar1);
  if (p->pManTime != (void *)0x0) {
    pTVar8 = Tim_ManDup((Tim_Man_t *)p->pManTime,0);
    p_00->pManTime = pTVar8;
  }
  iVar1 = Aig_ManCheck(p_00);
  if (iVar1 == 0) {
    printf("Aig_ManDupDfs(): The check has failed.\n");
  }
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupDfsGuided( Aig_Man_t * p, Vec_Ptr_t * vPios )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj, * pObjNew = NULL;
    int i, nNodes;
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->nAsserts = p->nAsserts;
    pNew->nConstrs = p->nConstrs;
    pNew->nBarBufs = p->nBarBufs;
    if ( p->vFlopNums )
        pNew->vFlopNums = Vec_IntDup( p->vFlopNums );
    // duplicate representation of choice nodes
    if ( p->pEquivs )
    {
        pNew->pEquivs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
        memset( pNew->pEquivs, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p) );
    }
    if ( p->pReprs )
    {
        pNew->pReprs = ABC_ALLOC( Aig_Obj_t *, Aig_ManObjNumMax(p) );
        memset( pNew->pReprs, 0, sizeof(Aig_Obj_t *) * Aig_ManObjNumMax(p) );
    }
    // create the PIs
    Aig_ManCleanData( p );
    // duplicate internal nodes
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Vec_PtrForEachEntry( Aig_Obj_t *, vPios, pObj, i )
    {
        if ( Aig_ObjIsCi(pObj) )
        {
            pObjNew = Aig_ObjCreateCi( pNew );
            pObjNew->Level = pObj->Level;
            pObj->pData = pObjNew;
        }
        else if ( Aig_ObjIsCo(pObj) )
        {
            Aig_ManDupDfsGuided_rec( pNew, p, Aig_ObjFanin0(pObj) );        
//            assert( pObj->Level == ((Aig_Obj_t*)pObj->pData)->Level );
            pObjNew = Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
            pObj->pData = pObjNew;
        }
    }
//    assert( Aig_ManBufNum(p) != 0 || Aig_ManNodeNum(p) == Aig_ManNodeNum(pNew) );
    if ( p->pEquivs == NULL && p->pReprs == NULL && (nNodes = Aig_ManCleanup( pNew )) )
        printf( "Aig_ManDupDfs(): Cleanup after AIG duplication removed %d nodes.\n", nNodes );
    Aig_ManSetRegNum( pNew, Aig_ManRegNum(p) );
    // duplicate the timing manager
    if ( p->pManTime )
        pNew->pManTime = Tim_ManDup( (Tim_Man_t *)p->pManTime, 0 );
    // check the resulting network
    if ( !Aig_ManCheck(pNew) )
        printf( "Aig_ManDupDfs(): The check has failed.\n" );
    return pNew;
}